

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void sorter_heap_sort(int64_t *dst,size_t size)

{
  long lVar1;
  int64_t _sort_swap_temp_2;
  ulong uVar2;
  int64_t _sort_swap_temp_1;
  ulong uVar3;
  ulong uVar4;
  int64_t _sort_swap_temp;
  ulong uVar5;
  ulong uVar6;
  
  if (1 < size) {
    uVar2 = size >> 1;
    uVar6 = size - 1;
    uVar4 = uVar2;
    for (uVar5 = size & 0xfffffffffffffffe; uVar5 <= uVar6; uVar5 = uVar5 * 2) {
      if ((uVar5 < uVar6) && (dst[uVar5] < dst[uVar5 + 1])) {
        uVar5 = uVar5 | 1;
      }
      lVar1 = dst[uVar4];
      if (dst[uVar5] <= lVar1) break;
      dst[uVar4] = dst[uVar5];
      dst[uVar5] = lVar1;
      uVar4 = uVar5;
    }
    do {
      lVar1 = uVar2 * 2;
      uVar2 = uVar2 - 1;
      uVar5 = lVar1 - 2;
      uVar4 = uVar2;
      while (uVar3 = uVar5, uVar3 <= uVar6) {
        if ((uVar3 < uVar6) && (dst[uVar3] < dst[uVar3 + 1])) {
          uVar3 = uVar3 | 1;
        }
        lVar1 = dst[uVar4];
        if (dst[uVar3] <= lVar1) break;
        dst[uVar4] = dst[uVar3];
        dst[uVar3] = lVar1;
        uVar4 = uVar3;
        uVar5 = uVar3 * 2;
      }
    } while (uVar2 != 0);
    do {
      uVar5 = uVar6;
      lVar1 = dst[uVar5];
      dst[uVar5] = *dst;
      *dst = lVar1;
      uVar6 = 0;
      uVar4 = 0;
      do {
        uVar2 = uVar6;
        if ((uVar6 < size - 2) && (dst[uVar6] < dst[uVar6 + 1])) {
          uVar2 = uVar6 | 1;
        }
        if (dst[uVar2] <= lVar1) break;
        dst[uVar4] = dst[uVar2];
        dst[uVar2] = lVar1;
        uVar6 = uVar2 * 2;
        uVar4 = uVar2;
      } while (uVar6 <= size - 2);
      uVar6 = uVar5 - 1;
      size = uVar5;
    } while (uVar5 - 1 != 0);
  }
  return;
}

Assistant:

void HEAP_SORT(SORT_TYPE *dst, const size_t size) {
  size_t end = size - 1;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  HEAPIFY(dst, size);

  while (end > 0) {
    SORT_SWAP(dst[end], dst[0]);
    HEAP_SIFT_DOWN(dst, 0, end - 1);
    end--;
  }
}